

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

float * Jf_ManInitRefs(Jf_Man_t *pMan)

{
  Gia_Man_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  float *pfVar8;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  ulong *puVar11;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  long lVar14;
  uint uVar15;
  size_t __nmemb;
  long lVar16;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  pGVar1 = pMan->pGia;
  if (pGVar1->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0xf9,"float *Jf_ManInitRefs(Jf_Man_t *)");
  }
  __nmemb = (size_t)pGVar1->nObjs;
  piVar6 = (int *)calloc(__nmemb,4);
  pGVar1->pRefs = piVar6;
  if (0 < (long)__nmemb) {
    lVar14 = 0;
    lVar16 = 0;
    do {
      pGVar2 = pGVar1->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = (Gia_Obj_t *)(&pGVar2->field_0x0 + lVar14);
      uVar9 = *(ulong *)pGVar7 & 0x1fffffff;
      if (uVar9 != 0x1fffffff && -1 < (int)*(ulong *)pGVar7) {
        iVar5 = (int)uVar9;
        pGVar13 = (Gia_Obj_t *)(lVar14 + (ulong)(uint)(iVar5 * 4) * -3 + (long)pGVar2);
        if ((pGVar13 < pGVar2) || (pGVar2 + (int)__nmemb <= pGVar13)) goto LAB_006c9210;
        piVar3 = pGVar1->pRefs;
        piVar6 = piVar3 + (int)(lVar14 + (ulong)(uint)(iVar5 << 2) * -3 >> 2) * -0x55555555;
        *piVar6 = *piVar6 + 1;
        uVar15 = (uint)*(undefined8 *)pGVar7;
        uVar12 = (uint)((ulong)*(undefined8 *)pGVar7 >> 0x20);
        if (((int)uVar15 < 0) ||
           ((uVar15 = uVar15 & 0x1fffffff, uVar15 == 0x1fffffff || (uVar15 != (uVar12 & 0x1fffffff))
            ))) {
          uVar12 = uVar12 & 0x1fffffff;
          pGVar13 = (Gia_Obj_t *)(lVar14 + (ulong)(uVar12 * 4) * -3 + (long)pGVar2);
          if ((pGVar13 < pGVar2) || (pGVar2 + pGVar1->nObjs <= pGVar13)) goto LAB_006c9210;
          piVar3 = piVar3 + (int)(lVar14 + (ulong)(uVar12 << 2) * -3 >> 2) * -0x55555555;
          *piVar3 = *piVar3 + 1;
          iVar5 = Gia_ObjIsMuxType(pGVar7);
          if (iVar5 != 0) {
            pGVar7 = Gia_ObjRecognizeMux(pGVar7,&local_40,&local_38);
            pGVar7 = (Gia_Obj_t *)((ulong)pGVar7 & 0xfffffffffffffffe);
            pGVar2 = pGVar1->pObjs;
            if ((pGVar7 < pGVar2) || (pGVar2 + pGVar1->nObjs <= pGVar7)) goto LAB_006c9210;
            piVar3 = pGVar1->pRefs;
            piVar6 = piVar3 + (int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555;
            *piVar6 = *piVar6 + -1;
            pGVar7 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
            if (pGVar7 == (Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe)) {
              if ((pGVar7 < pGVar2) || (pGVar2 + pGVar1->nObjs <= pGVar7)) goto LAB_006c9210;
              piVar3 = piVar3 + (int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555;
              *piVar3 = *piVar3 + -1;
            }
          }
        }
      }
      lVar16 = lVar16 + 1;
      __nmemb = (size_t)pGVar1->nObjs;
      lVar14 = lVar14 + 0xc;
    } while (lVar16 < (long)__nmemb);
  }
  pVVar4 = pGVar1->vCos;
  if (0 < pVVar4->nSize) {
    piVar6 = pVVar4->pArray;
    lVar14 = 0;
    do {
      iVar5 = piVar6[lVar14];
      if (((long)iVar5 < 0) || (pGVar1->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pGVar1->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = pGVar2 + iVar5 + -(ulong)((uint)*(undefined8 *)(pGVar2 + iVar5) & 0x1fffffff);
      if ((pGVar7 < pGVar2) || (pGVar2 + pGVar1->nObjs <= pGVar7)) goto LAB_006c9210;
      pGVar1->pRefs[(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555] =
           pGVar1->pRefs[(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555] + 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar4->nSize);
  }
  if ((pMan->pPars->fCoarsen != 0) && (pMan->nCoarse = 0, 0 < pGVar1->nObjs)) {
    lVar16 = 0;
    lVar14 = 0;
    do {
      pGVar2 = pGVar1->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar7 = (Gia_Obj_t *)(&pGVar2->field_0x0 + lVar16);
      if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
        iVar5 = Gia_ObjIsMuxType(pGVar7);
        if (iVar5 != 0) {
          uVar12 = (uint)*(undefined8 *)(&pGVar2->field_0x0 + lVar16) & 0x1fffffff;
          pGVar10 = (Gia_Obj_t *)((long)pGVar7 + (ulong)(uVar12 * 4) * -3);
          pGVar13 = pGVar1->pObjs;
          if ((pGVar10 < pGVar13) || (pGVar13 + pGVar1->nObjs <= pGVar10)) {
LAB_006c9210:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (pGVar1->pRefs
              [(int)((long)pGVar2 + lVar16 + ((ulong)(uVar12 * 4) * -3 - (long)pGVar13) >> 2) *
               -0x55555555] == 1) {
            puVar11 = (ulong *)((long)pGVar7 -
                               ((ulong)(uVar12 << 2) * 3 +
                               (ulong)((*(uint *)pGVar10 & 0x1fffffff) << 2) * 3));
            *puVar11 = *puVar11 & 0xffffffffbfffffff;
            uVar9 = (ulong)((*(uint *)(&pGVar2->field_0x4 + lVar16) & 0x1fffffff) << 2);
            puVar11 = (ulong *)((long)pGVar7 -
                               ((ulong)((*(uint *)((long)pGVar7 + uVar9 * -3) & 0x1fffffff) << 2) *
                                3 + uVar9 * 3));
            *puVar11 = *puVar11 & 0xffffffffbfffffff;
            uVar12 = (*(uint *)(&pGVar2->field_0x0 + lVar16) & 0x1fffffff) << 2;
            uVar9 = *(ulong *)((long)pGVar2 + lVar16 + (ulong)uVar12 * -3);
            if (((uint)uVar9 >> 0x1e & 1) != 0) goto LAB_006c924e;
            *(ulong *)((long)pGVar2 + lVar16 + (ulong)uVar12 * -3) = uVar9 | 0x40000000;
            pMan->nCoarse = pMan->nCoarse + 1;
          }
          uVar12 = (uint)((ulong)*(undefined8 *)(&pGVar2->field_0x0 + lVar16) >> 0x20) & 0x1fffffff;
          pGVar10 = (Gia_Obj_t *)((long)pGVar7 + (ulong)(uVar12 * 4) * -3);
          pGVar13 = pGVar1->pObjs;
          if ((pGVar10 < pGVar13) || (pGVar13 + pGVar1->nObjs <= pGVar10)) goto LAB_006c9210;
          if (pGVar1->pRefs
              [(int)((long)pGVar2 + lVar16 + ((ulong)(uVar12 << 2) * -3 - (long)pGVar13) >> 2) *
               -0x55555555] == 1) {
            uVar9 = (ulong)(((uint)*(undefined8 *)(&pGVar2->field_0x0 + lVar16) & 0x1fffffff) << 2);
            puVar11 = (ulong *)((long)pGVar7 -
                               ((ulong)((*(uint *)((long)pGVar7 + uVar9 * -3 + 4) & 0x1fffffff) << 2
                                       ) * 3 + uVar9 * 3));
            *puVar11 = *puVar11 & 0xffffffffbfffffff;
            uVar9 = (ulong)((*(uint *)(&pGVar2->field_0x4 + lVar16) & 0x1fffffff) << 2);
            puVar11 = (ulong *)((long)pGVar7 -
                               ((ulong)((*(uint *)((long)pGVar7 + uVar9 * -3 + 4) & 0x1fffffff) << 2
                                       ) * 3 + uVar9 * 3));
            *puVar11 = *puVar11 & 0xffffffffbfffffff;
            uVar12 = (*(uint *)(&pGVar2->field_0x4 + lVar16) & 0x1fffffff) << 2;
            uVar9 = *(ulong *)((long)pGVar2 + lVar16 + (ulong)uVar12 * -3);
            if (((uint)uVar9 >> 0x1e & 1) != 0) {
LAB_006c924e:
              __assert_fail("Jf_ObjIsUnit(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                            ,0x49,"void Jf_ObjCleanUnit(Gia_Obj_t *)");
            }
            *(ulong *)((long)pGVar2 + lVar16 + (ulong)uVar12 * -3) = uVar9 | 0x40000000;
            pMan->nCoarse = pMan->nCoarse + 1;
          }
        }
      }
      lVar14 = lVar14 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar14 < pGVar1->nObjs);
  }
  lVar14 = (long)pGVar1->nObjs;
  pfVar8 = (float *)malloc(lVar14 * 4);
  if (0 < lVar14) {
    piVar6 = pGVar1->pRefs;
    lVar16 = 0;
    do {
      iVar5 = piVar6[lVar16];
      if (piVar6[lVar16] < 2) {
        iVar5 = 1;
      }
      pfVar8[lVar16] = (float)iVar5;
      lVar16 = lVar16 + 1;
    } while (lVar14 != lVar16);
  }
  return pfVar8;
}

Assistant:

float * Jf_ManInitRefs( Jf_Man_t * pMan )
{
    Gia_Man_t * p = pMan->pGia;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1;
    float * pRes; int i;
    assert( p->pRefs == NULL );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_ObjRefFanin0Inc( p, pObj );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        Gia_ObjRefFanin1Inc( p, pObj );
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // discount XOR/MUX
        pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        Gia_ObjRefDec( p, Gia_Regular(pCtrl) );
        if ( Gia_Regular(pData1) == Gia_Regular(pData0) )
            Gia_ObjRefDec( p, Gia_Regular(pData1) );
    }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjRefFanin0Inc( p, pObj );
    // mark XOR/MUX internal nodes, which are not used elsewhere
    if ( pMan->pPars->fCoarsen )
    {
        pMan->nCoarse = 0;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 )
            {
                Jf_ObjSetUnit(Gia_ObjFanin0(Gia_ObjFanin0(pObj)));
                Jf_ObjSetUnit(Gia_ObjFanin0(Gia_ObjFanin1(pObj)));
                Jf_ObjCleanUnit(Gia_ObjFanin0(pObj)), pMan->nCoarse++;
            }
            if ( Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1 )
            {
                Jf_ObjSetUnit(Gia_ObjFanin1(Gia_ObjFanin0(pObj)));
                Jf_ObjSetUnit(Gia_ObjFanin1(Gia_ObjFanin1(pObj)));
                Jf_ObjCleanUnit(Gia_ObjFanin1(pObj)), pMan->nCoarse++;
            }
        }
    }
    // multiply by factor
    pRes = ABC_ALLOC( float, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        pRes[i] = Abc_MaxInt( 1, p->pRefs[i] );
    return pRes;
}